

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BDVFile.cpp
# Opt level: O3

bool BDVFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  bool bVar2;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"dd:1.3?,r?-=bb","");
  bVar1 = find_str_in_buf(&local_48,buf);
  bVar2 = true;
  if (!bVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"<<format.asc>>","");
    bVar1 = find_str_in_buf(&local_68,buf);
    if (bVar1) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"<<pins.asc>>","");
      bVar2 = find_str_in_buf(&local_88,buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool BDVFile::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("dd:1.3?,r?-=bb", buf) ||
	       (find_str_in_buf("<<format.asc>>", buf) && find_str_in_buf("<<pins.asc>>", buf));
}